

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O1

Float __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::PDF
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  long lVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  TransportMode mode_00;
  uint uVar21;
  BxDFFlags BVar22;
  ulong uVar23;
  uint uVar24;
  undefined4 in_register_00000034;
  ulong uVar25;
  DielectricInterfaceBxDF *pDVar26;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined4 uVar31;
  float fVar32;
  float fVar33;
  undefined4 extraout_XMM0_Dc;
  undefined8 in_XMM0_Qb;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar39 [16];
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined4 in_XMM5_Da;
  undefined1 in_register_00001344 [12];
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3f wo_02;
  Vector3f wo_03;
  Vector3f wo_04;
  Vector3f wo_05;
  Vector3f wo_06;
  Vector3f wo_07;
  Vector3f wo_08;
  Vector3f wo_09;
  Vector3f wo_10;
  Vector3f wo_11;
  Vector3f wo_12;
  Vector3f wo_13;
  Vector3f wi_00;
  Vector3f wi_01;
  Vector3f wi_02;
  Vector3f wi_03;
  Vector3f wi_04;
  Vector3f wi_05;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> toInterface;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> tiInterface;
  BSDFSample wis;
  BSDFSample wos;
  float local_150;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_138;
  undefined1 local_128 [16];
  float local_118;
  float fStack_114;
  uint uStack_110;
  uint uStack_10c;
  float local_108;
  float fStack_104;
  uint uStack_100;
  uint uStack_fc;
  Tuple2<pbrt::Point2,_float> local_f0;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_e8;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *local_d0;
  float local_c4;
  BSDFSample local_c0;
  BSDFSample local_9c;
  IdealDiffuseBxDF *local_78;
  IdealDiffuseBxDF *local_70;
  undefined1 local_68 [16];
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 auVar40 [64];
  undefined4 extraout_XMM0_Db;
  undefined1 extraout_var [60];
  
  auVar47._4_60_ = wi._12_60_;
  auVar47._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  local_128 = auVar47._0_16_;
  fVar41 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_118 = wi.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_114 = wi.super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_110 = (uint)in_XMM2_Qb;
  uStack_10c = (uint)((ulong)in_XMM2_Qb >> 0x20);
  local_108 = wo.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_104 = wo.super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_100 = (uint)in_XMM0_Qb;
  uStack_fc = (uint)((ulong)in_XMM0_Qb >> 0x20);
  if (sampleFlags != All) {
    LogFatal<char_const(&)[39]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bxdfs.h"
               ,0x41e,"Check failed: %s",(char (*) [39])"sampleFlags == BxDFReflTransFlags::All");
  }
  if (((this->config).twoSided != '\0') && (fVar41 < 0.0)) {
    local_108 = -local_108;
    fStack_104 = -fStack_104;
    uStack_100 = uStack_100 ^ 0x80000000;
    uStack_fc = uStack_fc ^ 0x80000000;
    fVar41 = -fVar41;
    local_118 = -local_118;
    fStack_114 = -fStack_114;
    uStack_110 = uStack_110 ^ 0x80000000;
    uStack_10c = uStack_10c ^ 0x80000000;
    local_128._0_8_ = CONCAT44(wi._12_4_,auVar47._0_4_) ^ 0x8000000080000000;
    local_128._8_4_ = wi._16_4_ ^ 0x80000000;
    local_128._12_4_ = wi._20_4_ ^ 0x80000000;
  }
  uVar24 = *(uint *)(Options + 4);
  wi_00.super_Tuple3<pbrt::Vector3,_float>.z = local_128._0_4_;
  local_c4 = wi_00.super_Tuple3<pbrt::Vector3,_float>.z * fVar41;
  local_150 = 0.0;
  if (0.0 < local_c4) {
    auVar28._0_4_ = (float)(this->config).nSamples;
    auVar28._4_12_ = in_register_00001344;
    if (0.0 < fVar41) {
      wo_00.super_Tuple3<pbrt::Vector3,_float>.y = fStack_104;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.x = local_108;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.y = fStack_114;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.x = local_118;
      in_register_00000034 = 0;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar41;
      auVar40._0_4_ = DielectricInterfaceBxDF::PDF(&this->top,wo_00,wi_00,mode,Reflection);
      auVar40._4_60_ = extraout_var;
      auVar28 = vfmadd213ss_fma(auVar40._0_16_,ZEXT416((uint)auVar28._0_4_),ZEXT416(0));
      local_150 = auVar28._0_4_;
    }
    else {
      auVar27._8_4_ = 0x7fffffff;
      auVar27._0_8_ = 0x7fffffff7fffffff;
      auVar27._12_4_ = 0x7fffffff;
      auVar27 = vandps_avx512vl(local_128,auVar27);
      auVar28 = vfmadd213ss_fma(ZEXT416((uint)(auVar27._0_4_ * 0.31830987)),auVar28,
                                ZEXT816(0) << 0x40);
      local_150 = auVar28._0_4_;
    }
  }
  bVar2 = (this->config).nSamples;
  if (bVar2 != 0) {
    uVar23 = CONCAT44(fStack_104,local_108) * -0x395b586ca42e166b;
    uVar23 = (CONCAT44(in_register_00000034,fVar41) ^
             ((uVar23 >> 0x2f ^ uVar23) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
             -0x395b586ca42e166b) * -0x395b586ca42e166b;
    uVar25 = CONCAT44(fStack_114,local_118) * -0x395b586ca42e166b;
    uVar23 = (uVar23 >> 0x2f ^ uVar23) * -0x395b586ca42e166b;
    uVar23 = (uVar24 & 0xffffff ^ uVar23 ^ 0x1a929e4d6f47a654 ^
             (uVar23 >> 0x2f | (ulong)(uVar24 & 0xff000000))) * -0x395b586ca42e166b;
    uVar25 = (CONCAT44(0x4fb7dae8,local_128._0_4_) ^
             ((uVar25 >> 0x2f ^ uVar25) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
             -0x395b586ca42e166b) * -0x395b586ca42e166b;
    uVar23 = (uVar23 >> 0x2f ^ uVar23) * -0x395b586ca42e166b;
    uVar25 = (uVar25 >> 0x2f ^ uVar25) * -0x395b586ca42e166b;
    uVar23 = uVar23 >> 0x2f ^ uVar23;
    lVar1 = uVar23 * 2 + 1;
    uVar23 = ((uVar25 >> 0x2f ^ uVar25) + 1) * 0x5851f42d4c957f2d + uVar23 * -0x4f5c17a566d501a4 + 1
    ;
    mode_00 = (TransportMode)(mode == Radiance);
    local_70 = &this->bottom;
    auVar35._8_4_ = 0x7fffffff;
    auVar35._0_8_ = 0x7fffffff7fffffff;
    auVar35._12_4_ = 0x7fffffff;
    auVar28 = vandps_avx512vl(local_128,auVar35);
    local_68 = ZEXT416((uint)(auVar28._0_4_ * 0.31830987));
    local_78 = (IdealDiffuseBxDF *)0x0;
    local_d0 = this;
    if (fVar41 <= 0.0) {
      local_d0 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0;
      local_78 = local_70;
    }
    local_50 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0;
    if (fVar41 <= 0.0) {
      local_50 = this;
    }
    uVar24 = 0;
    do {
      bVar2 = (byte)(uVar23 >> 0x38);
      uVar21 = (uint)(uVar23 >> 0x20);
      if (local_c4 <= 0.0) {
        if (0.0 < fVar41) {
          local_138.bottom = (IdealDiffuseBxDF *)0x0;
          local_138.top = &this->top;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_70;
          local_e8 = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>)
                     (auVar3 << 0x40);
        }
        else {
          auVar20._8_8_ = 0;
          auVar20._0_8_ = local_70;
          local_138 = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>)
                      (auVar20 << 0x40);
          local_e8.bottom = (IdealDiffuseBxDF *)0x0;
          local_e8.top = &this->top;
        }
        uVar21 = uVar21 >> 0xd ^ (uint)(uVar23 >> 0x1b);
        bVar2 = bVar2 >> 3;
        auVar18._4_12_ = in_register_00001344;
        auVar18._0_4_ = in_XMM5_Da;
        auVar28 = vcvtusi2ss_avx512f(auVar18,uVar21 >> bVar2 | uVar21 << 0x20 - bVar2);
        auVar28 = vminss_avx(ZEXT416((uint)(auVar28._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
        uVar23 = uVar23 * 0x5851f42d4c957f2d + lVar1;
        uVar25 = uVar23 * 0x5851f42d4c957f2d + lVar1;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = uVar23;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = uVar25;
        auVar35 = vpunpcklqdq_avx(auVar37,auVar44);
        auVar27 = vpsrlvq_avx2(auVar35,_DAT_005c85b0);
        auVar3 = vpsrlvq_avx2(auVar35,_DAT_005c85c0);
        auVar27 = vpshufd_avx(auVar27 ^ auVar3,0xe8);
        auVar35 = vpsrlq_avx(auVar35,0x3b);
        auVar35 = vpshufd_avx(auVar35,0xe8);
        auVar27 = vprorvd_avx512vl(auVar27,auVar35);
        auVar27 = vcvtudq2ps_avx512vl(auVar27);
        auVar10._8_4_ = 0x2f800000;
        auVar10._0_8_ = 0x2f8000002f800000;
        auVar10._12_4_ = 0x2f800000;
        auVar27 = vmulps_avx512vl(auVar27,auVar10);
        auVar11._8_4_ = 0x3f7fffff;
        auVar11._0_8_ = 0x3f7fffff3f7fffff;
        auVar11._12_4_ = 0x3f7fffff;
        auVar27 = vminps_avx512vl(auVar27,auVar11);
        local_f0 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar27);
        if (local_138.top == (DielectricInterfaceBxDF *)0x0) {
          wo_06.super_Tuple3<pbrt::Vector3,_float>.y = fStack_104;
          wo_06.super_Tuple3<pbrt::Vector3,_float>.x = local_108;
          wo_06.super_Tuple3<pbrt::Vector3,_float>.z = fVar41;
          IdealDiffuseBxDF::Sample_f
                    (&local_9c,local_138.bottom,wo_06,auVar28._0_4_,(Point2f *)&local_f0,mode,All);
        }
        else {
          wo_05.super_Tuple3<pbrt::Vector3,_float>.y = fStack_104;
          wo_05.super_Tuple3<pbrt::Vector3,_float>.x = local_108;
          wo_05.super_Tuple3<pbrt::Vector3,_float>.z = fVar41;
          DielectricInterfaceBxDF::Sample_f
                    (&local_9c,local_138.top,wo_05,auVar28._0_4_,(Point2f *)&local_f0,mode,All);
        }
        uVar23 = uVar25 * 0x5851f42d4c957f2d + lVar1;
        if ((0.0 < local_9c.pdf) &&
           (((local_9c.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
             (NAN(local_9c.wi.super_Tuple3<pbrt::Vector3,_float>.z))) &&
            (((undefined1)local_9c.flags & Reflection) == Unset)))) {
          uVar21 = (uint)(uVar23 >> 0x2d) ^ (uint)(uVar23 >> 0x1b);
          bVar2 = (byte)(uVar23 >> 0x3b);
          auVar19._4_12_ = in_register_00001344;
          auVar19._0_4_ = in_XMM5_Da;
          auVar28 = vcvtusi2ss_avx512f(auVar19,uVar21 >> bVar2 | uVar21 << 0x20 - bVar2);
          auVar28 = vminss_avx(ZEXT416((uint)(auVar28._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
          uVar23 = uVar23 * 0x5851f42d4c957f2d + lVar1;
          uVar25 = uVar23 * 0x5851f42d4c957f2d + lVar1;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar23;
          auVar45._8_8_ = 0;
          auVar45._0_8_ = uVar25;
          auVar35 = vpunpcklqdq_avx(auVar38,auVar45);
          auVar27 = vpsrlvq_avx2(auVar35,_DAT_005c85b0);
          auVar3 = vpsrlvq_avx2(auVar35,_DAT_005c85c0);
          auVar27 = vpshufd_avx(auVar27 ^ auVar3,0xe8);
          auVar35 = vpsrlq_avx(auVar35,0x3b);
          auVar35 = vpshufd_avx(auVar35,0xe8);
          auVar27 = vprorvd_avx512vl(auVar27,auVar35);
          auVar27 = vcvtudq2ps_avx512vl(auVar27);
          auVar12._8_4_ = 0x2f800000;
          auVar12._0_8_ = 0x2f8000002f800000;
          auVar12._12_4_ = 0x2f800000;
          auVar27 = vmulps_avx512vl(auVar27,auVar12);
          auVar13._8_4_ = 0x3f7fffff;
          auVar13._0_8_ = 0x3f7fffff3f7fffff;
          auVar13._12_4_ = 0x3f7fffff;
          auVar27 = vminps_avx512vl(auVar27,auVar13);
          local_f0 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar27);
          if (local_e8.top == (DielectricInterfaceBxDF *)0x0) {
            wo_10.super_Tuple3<pbrt::Vector3,_float>.y = fStack_114;
            wo_10.super_Tuple3<pbrt::Vector3,_float>.x = local_118;
            wo_10.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_128._0_4_;
            IdealDiffuseBxDF::Sample_f
                      (&local_c0,local_e8.bottom,wo_10,auVar28._0_4_,(Point2f *)&local_f0,mode_00,
                       All);
          }
          else {
            wo_07.super_Tuple3<pbrt::Vector3,_float>.y = fStack_114;
            wo_07.super_Tuple3<pbrt::Vector3,_float>.x = local_118;
            wo_07.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_128._0_4_;
            DielectricInterfaceBxDF::Sample_f
                      (&local_c0,local_e8.top,wo_07,auVar28._0_4_,(Point2f *)&local_f0,mode_00,All);
          }
          if (((0.0 < local_c0.pdf) &&
              ((local_c0.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
               (NAN(local_c0.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) &&
             (((undefined1)local_c0.flags & Reflection) == Unset)) {
            BVar22 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
                               (&local_138);
            if ((BVar22 & Specular) == Unset) {
              BVar22 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
                                 (&local_e8);
              if ((BVar22 & Specular) == Unset) {
                wi_03.super_Tuple3<pbrt::Vector3,_float>.z =
                     -local_c0.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                if (local_138.top == (DielectricInterfaceBxDF *)0x0) {
                  auVar14._8_4_ = 0x7fffffff;
                  auVar14._0_8_ = 0x7fffffff7fffffff;
                  auVar14._12_4_ = 0x7fffffff;
                  auVar28 = vandps_avx512vl(ZEXT416((uint)local_c0.wi.
                                                          super_Tuple3<pbrt::Vector3,_float>.z),
                                            auVar14);
                  auVar27 = ZEXT816(0);
                  uVar4 = vcmpss_avx512f(auVar27,ZEXT416((uint)(fVar41 * wi_03.
                                                  super_Tuple3<pbrt::Vector3,_float>.z)),1);
                  fVar32 = (float)((uint)((byte)uVar4 & 1) * (int)(auVar28._0_4_ * 0.31830987));
                  uVar29 = 0;
                  uVar30 = 0;
                  uVar31 = 0;
                }
                else {
                  wi_03.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                       local_c0.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                  wo_11.super_Tuple3<pbrt::Vector3,_float>.y = fStack_104;
                  wo_11.super_Tuple3<pbrt::Vector3,_float>.x = local_108;
                  wo_11.super_Tuple3<pbrt::Vector3,_float>.z = fVar41;
                  fVar32 = DielectricInterfaceBxDF::PDF(local_138.top,wo_11,wi_03,mode,All);
                  auVar27 = ZEXT816(0) << 0x40;
                  uVar29 = extraout_XMM0_Db;
                  uVar30 = extraout_XMM0_Dc;
                  uVar31 = extraout_XMM0_Dd;
                }
                wo_13.super_Tuple3<pbrt::Vector3,_float>.z =
                     -local_9c.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                if (local_e8.top == (DielectricInterfaceBxDF *)0x0) {
                  uVar4 = vcmpss_avx512f(auVar27,ZEXT416((uint)(wo_13.
                                                  super_Tuple3<pbrt::Vector3,_float>.z *
                                                  (float)local_128._0_4_)),1);
                  fVar33 = (float)((uint)((byte)uVar4 & 1) * local_68._0_4_);
                }
                else {
                  wo_13.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                       local_9c.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                  wi_05.super_Tuple3<pbrt::Vector3,_float>.y = fStack_114;
                  wi_05.super_Tuple3<pbrt::Vector3,_float>.x = local_118;
                  wi_05.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_128._0_4_;
                  local_48 = fVar32;
                  uStack_44 = uVar29;
                  uStack_40 = uVar30;
                  uStack_3c = uVar31;
                  fVar33 = DielectricInterfaceBxDF::PDF(local_e8.top,wo_13,wi_05,mode,All);
                  fVar32 = local_48;
                }
                fVar32 = (fVar32 + fVar33) * 0.5;
              }
              else {
                if (local_138.top != (DielectricInterfaceBxDF *)0x0) {
                  auVar46._0_8_ =
                       local_c0.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                  auVar46._8_4_ = 0x80000000;
                  auVar46._12_4_ = 0x80000000;
                  auVar39._4_4_ = fStack_104;
                  auVar39._0_4_ = local_108;
                  auVar39._8_4_ = uStack_100;
                  auVar39._12_4_ = uStack_fc;
                  pDVar26 = local_138.top;
                  fVar33 = -local_c0.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                  fVar32 = fVar41;
                  goto LAB_0034310a;
                }
                auVar15._8_4_ = 0x7fffffff;
                auVar15._0_8_ = 0x7fffffff7fffffff;
                auVar15._12_4_ = 0x7fffffff;
                auVar28 = vandps_avx512vl(ZEXT416((uint)local_c0.wi.
                                                        super_Tuple3<pbrt::Vector3,_float>.z),
                                          auVar15);
                uVar4 = vcmpss_avx512f(ZEXT816(0),
                                       ZEXT416((uint)(fVar41 * -local_c0.wi.
                                                                super_Tuple3<pbrt::Vector3,_float>.z
                                                     )),1);
                fVar32 = (float)((uint)((byte)uVar4 & 1) * (int)(auVar28._0_4_ * 0.31830987));
              }
            }
            else {
              fVar32 = -local_9c.wi.super_Tuple3<pbrt::Vector3,_float>.z;
              if (local_e8.top == (DielectricInterfaceBxDF *)0x0) {
                uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x20,
                                       ZEXT416((uint)(fVar32 * (float)local_128._0_4_)),1);
                fVar32 = (float)((uint)((byte)uVar4 & 1) * local_68._0_4_);
              }
              else {
                auVar39._0_8_ =
                     local_9c.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                auVar39._8_4_ = 0x80000000;
                auVar39._12_4_ = 0x80000000;
                auVar46._4_4_ = fStack_114;
                auVar46._0_4_ = local_118;
                auVar46._8_4_ = uStack_110;
                auVar46._12_4_ = uStack_10c;
                pDVar26 = local_e8.top;
                fVar33 = (float)local_128._0_4_;
LAB_0034310a:
                wo_12.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar39._0_8_;
                wo_12.super_Tuple3<pbrt::Vector3,_float>.z = fVar32;
                wi_04.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar46._0_8_;
                wi_04.super_Tuple3<pbrt::Vector3,_float>.z = fVar33;
                fVar32 = DielectricInterfaceBxDF::PDF(pDVar26,wo_12,wi_04,mode,All);
              }
            }
LAB_00343226:
            local_150 = local_150 + fVar32;
          }
          goto LAB_00343236;
        }
      }
      else {
        uVar21 = uVar21 >> 0xd ^ (uint)(uVar23 >> 0x1b);
        bVar2 = bVar2 >> 3;
        uVar23 = uVar23 * 0x5851f42d4c957f2d + lVar1;
        uVar25 = uVar23 * 0x5851f42d4c957f2d + lVar1;
        auVar16._4_12_ = in_register_00001344;
        auVar16._0_4_ = in_XMM5_Da;
        auVar28 = vcvtusi2ss_avx512f(auVar16,uVar21 >> bVar2 | uVar21 << 0x20 - bVar2);
        auVar28 = vminss_avx(ZEXT416((uint)(auVar28._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
        auVar34._8_8_ = 0;
        auVar34._0_8_ = uVar23;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = uVar25;
        auVar35 = vpunpcklqdq_avx(auVar34,auVar42);
        auVar27 = vpsrlvq_avx2(auVar35,_DAT_005c85b0);
        auVar3 = vpsrlvq_avx2(auVar35,_DAT_005c85c0);
        auVar27 = vpshufd_avx(auVar27 ^ auVar3,0xe8);
        auVar35 = vpsrlq_avx(auVar35,0x3b);
        auVar35 = vpshufd_avx(auVar35,0xe8);
        auVar27 = vprorvd_avx512vl(auVar27,auVar35);
        auVar27 = vcvtudq2ps_avx512vl(auVar27);
        auVar5._8_4_ = 0x2f800000;
        auVar5._0_8_ = 0x2f8000002f800000;
        auVar5._12_4_ = 0x2f800000;
        auVar27 = vmulps_avx512vl(auVar27,auVar5);
        auVar6._8_4_ = 0x3f7fffff;
        auVar6._0_8_ = 0x3f7fffff3f7fffff;
        auVar6._12_4_ = 0x3f7fffff;
        auVar27 = vminps_avx512vl(auVar27,auVar6);
        pDVar26 = (DielectricInterfaceBxDF *)vmovlps_avx(auVar27);
        local_138.top = pDVar26;
        if (0.0 < fVar41) {
          wo_02.super_Tuple3<pbrt::Vector3,_float>.y = fStack_104;
          wo_02.super_Tuple3<pbrt::Vector3,_float>.x = local_108;
          wo_02.super_Tuple3<pbrt::Vector3,_float>.z = fVar41;
          DielectricInterfaceBxDF::Sample_f
                    (&local_9c,&local_d0->top,wo_02,auVar28._0_4_,(Point2f *)&local_138,mode,All);
        }
        else {
          wo_01.super_Tuple3<pbrt::Vector3,_float>.y = fStack_104;
          wo_01.super_Tuple3<pbrt::Vector3,_float>.x = local_108;
          wo_01.super_Tuple3<pbrt::Vector3,_float>.z = fVar41;
          IdealDiffuseBxDF::Sample_f
                    (&local_9c,local_78,wo_01,auVar28._0_4_,(Point2f *)&local_138,mode,All);
        }
        uVar23 = uVar25 * 0x5851f42d4c957f2d + lVar1;
        if (((local_9c.pdf <= 0.0) ||
            ((local_9c.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
             (!NAN(local_9c.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) ||
           (((undefined1)local_9c.flags & Reflection) != Unset)) {
          fVar32 = (float)local_68._0_4_;
          if (0.0 < fVar41) {
            wo_04.super_Tuple3<pbrt::Vector3,_float>.y = fStack_104;
            wo_04.super_Tuple3<pbrt::Vector3,_float>.x = local_108;
            wi_01.super_Tuple3<pbrt::Vector3,_float>.y = fStack_114;
            wi_01.super_Tuple3<pbrt::Vector3,_float>.x = local_118;
            wo_04.super_Tuple3<pbrt::Vector3,_float>.z = fVar41;
            wi_01.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_128._0_4_;
            fVar32 = DielectricInterfaceBxDF::PDF(&local_d0->top,wo_04,wi_01,mode,All);
          }
          local_150 = local_150 + fVar32;
        }
        else {
          uVar21 = (uint)(uVar23 >> 0x2d) ^ (uint)(uVar23 >> 0x1b);
          bVar2 = (byte)(uVar23 >> 0x3b);
          uVar23 = uVar23 * 0x5851f42d4c957f2d + lVar1;
          uVar25 = uVar23 * 0x5851f42d4c957f2d + lVar1;
          auVar17._4_12_ = in_register_00001344;
          auVar17._0_4_ = in_XMM5_Da;
          auVar28 = vcvtusi2ss_avx512f(auVar17,uVar21 >> bVar2 | uVar21 << 0x20 - bVar2);
          auVar28 = vminss_avx(ZEXT416((uint)(auVar28._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
          auVar36._8_8_ = 0;
          auVar36._0_8_ = uVar23;
          auVar43._8_8_ = 0;
          auVar43._0_8_ = uVar25;
          auVar35 = vpunpcklqdq_avx(auVar36,auVar43);
          auVar27 = vpsrlvq_avx2(auVar35,_DAT_005c85b0);
          auVar3 = vpsrlvq_avx2(auVar35,_DAT_005c85c0);
          auVar27 = vpshufd_avx(auVar27 ^ auVar3,0xe8);
          auVar35 = vpsrlq_avx(auVar35,0x3b);
          auVar35 = vpshufd_avx(auVar35,0xe8);
          auVar27 = vprorvd_avx512vl(auVar27,auVar35);
          auVar27 = vcvtudq2ps_avx512vl(auVar27);
          auVar7._8_4_ = 0x2f800000;
          auVar7._0_8_ = 0x2f8000002f800000;
          auVar7._12_4_ = 0x2f800000;
          auVar27 = vmulps_avx512vl(auVar27,auVar7);
          auVar8._8_4_ = 0x3f7fffff;
          auVar8._0_8_ = 0x3f7fffff3f7fffff;
          auVar8._12_4_ = 0x3f7fffff;
          auVar27 = vminps_avx512vl(auVar27,auVar8);
          pDVar26 = (DielectricInterfaceBxDF *)vmovlps_avx(auVar27);
          local_138.top = pDVar26;
          if (0.0 < fVar41) {
            wo_08.super_Tuple3<pbrt::Vector3,_float>.y = fStack_114;
            wo_08.super_Tuple3<pbrt::Vector3,_float>.x = local_118;
            wo_08.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_128._0_4_;
            DielectricInterfaceBxDF::Sample_f
                      (&local_c0,&local_d0->top,wo_08,auVar28._0_4_,(Point2f *)&local_138,mode_00,
                       All);
          }
          else {
            wo_03.super_Tuple3<pbrt::Vector3,_float>.y = fStack_114;
            wo_03.super_Tuple3<pbrt::Vector3,_float>.x = local_118;
            wo_03.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_128._0_4_;
            IdealDiffuseBxDF::Sample_f
                      (&local_c0,local_78,wo_03,auVar28._0_4_,(Point2f *)&local_138,mode_00,All);
          }
          if ((0.0 < local_c0.pdf) &&
             (((local_c0.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
               (NAN(local_c0.wi.super_Tuple3<pbrt::Vector3,_float>.z))) &&
              (((undefined1)local_c0.flags & Reflection) == Unset)))) {
            if (0.0 < fVar41) {
              auVar9._8_4_ = 0x7fffffff;
              auVar9._0_8_ = 0x7fffffff7fffffff;
              auVar9._12_4_ = 0x7fffffff;
              auVar28 = vandps_avx512vl(ZEXT416((uint)local_c0.wi.super_Tuple3<pbrt::Vector3,_float>
                                                      .z),auVar9);
              uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                     ZEXT416((uint)(local_9c.wi.super_Tuple3<pbrt::Vector3,_float>.z
                                                   * local_c0.wi.super_Tuple3<pbrt::Vector3,_float>.
                                                     z)),1);
              fVar32 = (float)((uint)((byte)uVar4 & 1) * (int)(auVar28._0_4_ * 0.31830987));
            }
            else {
              wi_02.super_Tuple3<pbrt::Vector3,_float>.z =
                   -local_c0.wi.super_Tuple3<pbrt::Vector3,_float>.z;
              wo_09.super_Tuple3<pbrt::Vector3,_float>.z =
                   -local_9c.wi.super_Tuple3<pbrt::Vector3,_float>.z;
              wi_02.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                   local_c0.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
              wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                   local_9c.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
              fVar32 = DielectricInterfaceBxDF::PDF(&local_50->top,wo_09,wi_02,mode,All);
            }
            goto LAB_00343226;
          }
LAB_00343236:
          uVar23 = uVar25 * 0x5851f42d4c957f2d + lVar1;
        }
      }
      uVar24 = uVar24 + 1;
      bVar2 = (this->config).nSamples;
    } while (uVar24 < bVar2);
  }
  return (local_150 / (float)bVar2) * 0.9 + 0.007957749;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        CHECK(sampleFlags == BxDFReflTransFlags::All);  // for now
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            // BIG WIN
            wo = -wo;
            wi = -wi;
        }

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        bool enteredTop = wo.z > 0;
        Float pdfSum = 0;
        // Update _pdfSum_ for reflection at the entrance layer
        if (SameHemisphere(wo, wi)) {
            if (enteredTop)
                pdfSum += config.nSamples *
                          top.PDF(wo, wi, mode, BxDFReflTransFlags::Reflection);
            else
                pdfSum += config.nSamples *
                          bottom.PDF(wo, wi, mode, BxDFReflTransFlags::Reflection);
        }

        for (int s = 0; s < config.nSamples; ++s) {
            // Evaluate layered BSDF PDF sample
            if (SameHemisphere(wo, wi)) {
                // Evaluate TRT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> rInterface, tInterface;
                if (enteredTop) {
                    rInterface = &bottom;
                    tInterface = &top;
                } else {
                    rInterface = &top;
                    tInterface = &bottom;
                }
                // Sample _tInterface_ to get direction into the layers
                Float uc = r();
                Point2f u(r(), r());
                BSDFSample wos = tInterface.Sample_f(wo, uc, u, mode);

                // Update _pdfSum_ accounting for TRT scattering events
                if (!wos || wos.wi.z == 0 || wos.IsReflection()) {
                    pdfSum += tInterface.PDF(wo, wi, mode);
                } else {
                    uc = r();
                    u = Point2f(r(), r());
                    BSDFSample wis = tInterface.Sample_f(wi, uc, u, ~mode);
                    if (!wis || wis.wi.z == 0 || wis.IsReflection())
                        continue;
                    // if (IsSpecular(tInterface.Flags()))
                    pdfSum += rInterface.PDF(-wos.wi, -wis.wi, mode);
                }

            } else {
                // Evaluate TT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> toInterface, tiInterface;
                if (enteredTop) {
                    toInterface = &top;
                    tiInterface = &bottom;
                } else {
                    toInterface = &bottom;
                    tiInterface = &top;
                }

                Float uc = r();
                Point2f u(r(), r());
                BSDFSample wos = toInterface.Sample_f(wo, uc, u, mode);
                if (!wos || wos.wi.z == 0 || wos.IsReflection())
                    continue;

                uc = r();
                u = Point2f(r(), r());
                BSDFSample wis = tiInterface.Sample_f(wi, uc, u, ~mode);
                if (!wis || wis.wi.z == 0 || wis.IsReflection())
                    continue;

                if (IsSpecular(toInterface.Flags()))
                    pdfSum += tiInterface.PDF(-wos.wi, wi, mode);
                else if (IsSpecular(tiInterface.Flags()))
                    pdfSum += toInterface.PDF(wo, -wis.wi, mode);
                else
                    pdfSum += (toInterface.PDF(wo, -wis.wi, mode) +
                               tiInterface.PDF(-wos.wi, wi, mode)) /
                              2;
            }
        }
        // Return mixture of PDF estimate and constant PDF
        return Lerp(.9, 1 / (4 * Pi), pdfSum / config.nSamples);
    }